

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int BUFFER_content(BUFFER_HANDLE handle,uchar **content)

{
  BUFFER *b;
  int result;
  uchar **content_local;
  BUFFER_HANDLE handle_local;
  
  if ((handle == (BUFFER_HANDLE)0x0) || (content == (uchar **)0x0)) {
    b._4_4_ = 0x131;
  }
  else {
    *content = handle->buffer;
    b._4_4_ = 0;
  }
  return b._4_4_;
}

Assistant:

int BUFFER_content(BUFFER_HANDLE handle, const unsigned char** content)
{
    int result;
    if ((handle == NULL) || (content == NULL))
    {
        /* Codes_SRS_BUFFER_07_020: [If the handle and/or content*is NULL BUFFER_content shall return nonzero.] */
        result = MU_FAILURE;
    }
    else
    {
        BUFFER* b = (BUFFER*)handle;
        *content = b->buffer;
        result = 0;
    }
    return result;
}